

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  EVP_PKEY_CTX *in_RDI;
  FileException error;
  
  init(in_RDI);
  readFrames();
  AviWriter::completeOutputFile
            ((AviWriter *)
             writer._M_t.super___uniq_ptr_impl<AviWriter,_std::default_delete<AviWriter>_>._M_t.
             super__Tuple_impl<0UL,_AviWriter_*,_std::default_delete<AviWriter>_>.
             super__Head_base<0UL,_AviWriter_*,_false>._M_head_impl);
  std::__uniq_ptr_impl<AviWriter,_std::default_delete<AviWriter>_>::reset
            ((__uniq_ptr_impl<AviWriter,_std::default_delete<AviWriter>_> *)&writer,(pointer)0x0);
  return 0;
}

Assistant:

int main() {

    init();

    try {
        readFrames();
    } catch (const FileException error) {
        std::cerr << error.what() << std::endl;
        return 1;
    }

    writer->completeOutputFile();

    writer.reset(nullptr);

    return 0;
}